

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int uv__tcp_connect(uv_connect_t *req,uv_tcp_t *handle,sockaddr *addr,uint addrlen,uv_connect_cb cb)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int r;
  int err;
  sockaddr_in6 tmp6;
  uv_connect_cb cb_local;
  sockaddr *psStack_28;
  uint addrlen_local;
  sockaddr *addr_local;
  uv_tcp_t *handle_local;
  uv_connect_t *req_local;
  
  tmp6._20_8_ = cb;
  if (handle->type != UV_TCP) {
    __assert_fail("handle->type == UV_TCP",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/tcp.c"
                  ,0x118,
                  "int uv__tcp_connect(uv_connect_t *, uv_tcp_t *, const struct sockaddr *, unsigned int, uv_connect_cb)"
                 );
  }
  if (handle->connect_req == (uv_connect_t *)0x0) {
    if (handle->delayed_error == 0) {
      iVar1 = maybe_new_socket(handle,(uint)addr->sa_family,0xc000);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = uv__is_ipv6_link_local(addr);
      psStack_28 = (sockaddr *)addr;
      if (iVar1 != 0) {
        r._0_2_ = addr->sa_family;
        r._2_1_ = addr->sa_data[0];
        r._3_1_ = addr->sa_data[1];
        unique0x00012004 = addr->sa_data[2];
        unique0x00012005 = addr->sa_data[3];
        unique0x00012006 = addr->sa_data[4];
        unique0x00012007 = addr->sa_data[5];
        tmp6._0_8_ = *(undefined8 *)(addr->sa_data + 6);
        tmp6.sin6_addr.__in6_u._0_2_ = addr[1].sa_family;
        tmp6.sin6_addr.__in6_u._2_1_ = addr[1].sa_data[0];
        tmp6.sin6_addr.__in6_u._3_1_ = addr[1].sa_data[1];
        tmp6.sin6_addr.__in6_u._4_1_ = addr[1].sa_data[2];
        tmp6.sin6_addr.__in6_u._5_1_ = addr[1].sa_data[3];
        tmp6.sin6_addr.__in6_u._6_1_ = addr[1].sa_data[4];
        tmp6.sin6_addr.__in6_u._7_1_ = addr[1].sa_data[5];
        tmp6.sin6_addr.__in6_u.__u6_addr32[2] = *(undefined4 *)(addr[1].sa_data + 6);
        if (tmp6.sin6_addr.__in6_u.__u6_addr32[2] == 0) {
          tmp6.sin6_addr.__in6_u.__u6_addr32[2] = uv__ipv6_link_local_scope_id();
          psStack_28 = (sockaddr *)&r;
        }
      }
      do {
        piVar2 = __errno_location();
        *piVar2 = 0;
        iVar1 = connect((handle->io_watcher).fd,psStack_28,addrlen);
        bVar3 = false;
        if (iVar1 == -1) {
          piVar2 = __errno_location();
          bVar3 = *piVar2 == 4;
        }
      } while (bVar3);
      if (((iVar1 == -1) && (piVar2 = __errno_location(), *piVar2 != 0)) &&
         (piVar2 = __errno_location(), *piVar2 != 0x73)) {
        piVar2 = __errno_location();
        if (*piVar2 != 0x6f) {
          piVar2 = __errno_location();
          return -*piVar2;
        }
        handle->delayed_error = -0x6f;
      }
    }
    req->loop = handle->loop;
    req->type = UV_CONNECT;
    (handle->loop->active_reqs).count = (handle->loop->active_reqs).count + 1;
    req->cb = (uv_connect_cb)tmp6._20_8_;
    req->handle = (uv_stream_t *)handle;
    uv__queue_init(&req->queue);
    handle->connect_req = req;
    uv__io_start(handle->loop,&handle->io_watcher,4);
    if (handle->delayed_error != 0) {
      uv__io_feed(handle->loop,&handle->io_watcher);
    }
    req_local._4_4_ = 0;
  }
  else {
    req_local._4_4_ = -0x72;
  }
  return req_local._4_4_;
}

Assistant:

int uv__tcp_connect(uv_connect_t* req,
                    uv_tcp_t* handle,
                    const struct sockaddr* addr,
                    unsigned int addrlen,
                    uv_connect_cb cb) {
  struct sockaddr_in6 tmp6;
  int err;
  int r;

  assert(handle->type == UV_TCP);

  if (handle->connect_req != NULL)
    return UV_EALREADY;  /* FIXME(bnoordhuis) UV_EINVAL or maybe UV_EBUSY. */

  if (handle->delayed_error != 0)
    goto out;

  err = maybe_new_socket(handle,
                         addr->sa_family,
                         UV_HANDLE_READABLE | UV_HANDLE_WRITABLE);
  if (err)
    return err;

  if (uv__is_ipv6_link_local(addr)) {
    memcpy(&tmp6, addr, sizeof(tmp6));
    if (tmp6.sin6_scope_id == 0) {
      tmp6.sin6_scope_id = uv__ipv6_link_local_scope_id();
      addr = (void*) &tmp6;
    }
  }

  do {
    errno = 0;
    r = connect(uv__stream_fd(handle), addr, addrlen);
  } while (r == -1 && errno == EINTR);

  /* We not only check the return value, but also check the errno != 0.
   * Because in rare cases connect() will return -1 but the errno
   * is 0 (for example, on Android 4.3, OnePlus phone A0001_12_150227)
   * and actually the tcp three-way handshake is completed.
   */
  if (r == -1 && errno != 0) {
    if (errno == EINPROGRESS)
      ; /* not an error */
    else if (errno == ECONNREFUSED
#if defined(__OpenBSD__)
      || errno == EINVAL
#endif
      )
    /* If we get ECONNREFUSED (Solaris) or EINVAL (OpenBSD) wait until the
     * next tick to report the error. Solaris and OpenBSD wants to report
     * immediately -- other unixes want to wait.
     */
      handle->delayed_error = UV__ERR(ECONNREFUSED);
    else
      return UV__ERR(errno);
  }

out:

  uv__req_init(handle->loop, req, UV_CONNECT);
  req->cb = cb;
  req->handle = (uv_stream_t*) handle;
  uv__queue_init(&req->queue);
  handle->connect_req = req;

  uv__io_start(handle->loop, &handle->io_watcher, POLLOUT);

  if (handle->delayed_error)
    uv__io_feed(handle->loop, &handle->io_watcher);

  return 0;
}